

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O3

void __thiscall QFusionStylePrivate::QFusionStylePrivate(QFusionStylePrivate *this)

{
  QObjectPrivate::QObjectPrivate((QObjectPrivate *)this,QObjectPrivateVersion);
  (this->super_QCommonStylePrivate).super_QStylePrivate.name.d.size = 0;
  (this->super_QCommonStylePrivate).super_QStylePrivate.name.d.d = (Data *)0x0;
  (this->super_QCommonStylePrivate).super_QStylePrivate.name.d.ptr = (char16_t *)0x0;
  *(undefined ***)&(this->super_QCommonStylePrivate).super_QStylePrivate =
       &PTR__QCommonStylePrivate_007e93a0;
  (this->super_QCommonStylePrivate).decorationRect.x1 = 0;
  (this->super_QCommonStylePrivate).decorationRect.y1 = 0;
  (this->super_QCommonStylePrivate).decorationRect.x2 = -1;
  (this->super_QCommonStylePrivate).decorationRect.y2 = -1;
  (this->super_QCommonStylePrivate).displayRect.x1 = 0;
  (this->super_QCommonStylePrivate).displayRect.y1 = 0;
  (this->super_QCommonStylePrivate).displayRect.x2 = -1;
  (this->super_QCommonStylePrivate).displayRect.y2 = -1;
  (this->super_QCommonStylePrivate).checkRect.x1 = 0;
  (this->super_QCommonStylePrivate).checkRect.y1 = 0;
  (this->super_QCommonStylePrivate).checkRect.x2 = -1;
  (this->super_QCommonStylePrivate).checkRect.y2 = -1;
  (this->super_QCommonStylePrivate).cachedOption = (QStyleOptionViewItem *)0x0;
  QIcon::QIcon(&(this->super_QCommonStylePrivate).tabBarcloseButtonIcon);
  (this->super_QCommonStylePrivate).animations.d = (Data *)0x0;
  *(undefined ***)&(this->super_QCommonStylePrivate).super_QStylePrivate =
       &PTR__QCommonStylePrivate_007ed748;
  (this->super_QCommonStylePrivate).animationFps = 0x3c;
  return;
}

Assistant:

QFusionStylePrivate::QFusionStylePrivate()
{
    animationFps = 60;
}